

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_scalingFactorGrandchildUnitsNotFound_Test::~Units_scalingFactorGrandchildUnitsNotFound_Test
          (Units_scalingFactorGrandchildUnitsNotFound_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorGrandchildUnitsNotFound)
{
    auto model = libcellml::Model::create("nurseryrhymes");

    auto u0 = libcellml::Units::create("sheep");
    u0->addUnit("wool");

    auto u1 = libcellml::Units::create("bo_peep");
    u1->addUnit("sheep");

    auto u2 = libcellml::Units::create("flock");
    u2->addUnit("sheep");

    model->addUnits(u0);
    model->addUnits(u1);
    model->addUnits(u2);

    // Child units of "wool" are not found within "sheep" units.  Comparison should return 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
}